

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_array.h
# Opt level: O2

bool COST_SENSITIVE::test_label(void *v)

{
  float fVar1;
  bool bVar2;
  long lVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  label *ld;
  
  lVar3 = *(long *)((long)v + 8) - *v;
  if (lVar3 == 0) {
    return true;
  }
  uVar4 = lVar3 >> 4;
  uVar5 = 0;
  while( true ) {
    uVar6 = (ulong)uVar5;
    bVar2 = uVar4 <= uVar6;
    if (uVar4 <= uVar6) {
      return bVar2;
    }
    fVar1 = *(float *)(*v + uVar6 * 0x10);
    uVar5 = uVar5 + 1;
    if (fVar1 != 3.4028235e+38) break;
    if (NAN(fVar1)) {
      return bVar2;
    }
  }
  return bVar2;
}

Assistant:

T& operator[](size_t i) const { return _begin[i]; }